

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

QRect __thiscall QSystemTrayIconSys::globalGeometry(QSystemTrayIconSys *this)

{
  QRect QVar1;
  QSize this_00;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QWidget *this_01;
  QPoint *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  undefined1 local_28 [32];
  QWidgetData *local_8;
  
  local_8 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_01 = (QWidget *)local_28;
  QPoint::QPoint(in_RDI,(int)((ulong)this_01 >> 0x20),(int)this_01);
  local_28._8_8_ = QWidget::mapToGlobal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = QWidget::size(this_01);
  QRect::QRect((QRect *)this_00,in_RDI,(QSize *)in_stack_ffffffffffffffc0);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.x2.m_i = local_28._24_4_;
    QVar1.y2.m_i = local_28._28_4_;
    QVar1.x1.m_i = local_28._16_4_;
    QVar1.y1.m_i = local_28._20_4_;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect QSystemTrayIconSys::globalGeometry() const
{
    return QRect(mapToGlobal(QPoint(0, 0)), size());
}